

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::DimensionSpecifierSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == QueueDimensionSpecifier) || (kind == RangeDimensionSpecifier)) ||
     (kind == WildcardDimensionSpecifier)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DimensionSpecifierSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::QueueDimensionSpecifier:
        case SyntaxKind::RangeDimensionSpecifier:
        case SyntaxKind::WildcardDimensionSpecifier:
            return true;
        default:
            return false;
    }
}